

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listInput.cpp
# Opt level: O0

void __thiscall listInput::drawHighlight(listInput *this)

{
  WINDOW *pWVar1;
  undefined8 uVar2;
  int local_58;
  int local_54;
  string local_38 [32];
  int local_18;
  int local_14;
  int x;
  int y;
  listInput *this_local;
  
  if (this->numWin == (WINDOW *)0x0) {
    local_54 = -1;
  }
  else {
    local_54 = (int)this->numWin->_begy;
  }
  local_14 = local_54;
  if (this->numWin == (WINDOW *)0x0) {
    local_58 = -1;
  }
  else {
    local_58 = (int)this->numWin->_begx;
  }
  local_18 = local_58;
  _x = this;
  if (this->highlight != (WINDOW *)0x0) {
    werase(this->highlight);
    delwin(this->highlight);
  }
  pWVar1 = (WINDOW *)newwin(1,4,local_14 + this->current,local_18 + 1);
  this->highlight = pWVar1;
  wbkgd(this->numWin,0x500);
  wbkgd(this->highlight,0x100);
  pWVar1 = this->highlight;
  std::vector<int,_std::allocator<int>_>::operator[](&this->numStorage,(long)(this->current + 1));
  makeThreeDigit_abi_cxx11_((int)local_38);
  uVar2 = std::__cxx11::string::c_str();
  wprintw(pWVar1,"%s",uVar2);
  std::__cxx11::string::~string(local_38);
  wrefresh(this->highlight);
  return;
}

Assistant:

void listInput::drawHighlight() {
  int y,x;
  getbegyx(numWin, y, x);
  if(highlight){
    werase(highlight);
    delwin(highlight);
  }
  highlight = newwin(1, INPUT_LIST_WIDTH,y + current, x + 1);
  wbkgd(numWin, COLOR_PAIR(5));
  wbkgd(highlight, COLOR_PAIR(1));
  wprintw(highlight, "%s", makeThreeDigit(numStorage[current+1]).c_str());
  wrefresh(highlight);
}